

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir_nav_kernel_2.cpp
# Opt level: O2

bool __thiscall dlib::file::operator==(file *this,file *rhs)

{
  __type _Var1;
  char *pcVar2;
  string right;
  string left;
  char buf [4096];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1058;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1038;
  char local_1018 [4104];
  
  _Var1 = true;
  if ((rhs->state).full_name._M_string_length != 0 || (this->state).full_name._M_string_length != 0)
  {
    local_1038._M_dataplus._M_p = (pointer)&local_1038.field_2;
    local_1038._M_string_length = 0;
    local_1058._M_dataplus._M_p = (pointer)&local_1058.field_2;
    local_1058._M_string_length = 0;
    _Var1 = false;
    local_1038.field_2._M_local_buf[0] = '\0';
    local_1058.field_2._M_local_buf[0] = '\0';
    pcVar2 = realpath((this->state).full_name._M_dataplus._M_p,local_1018);
    if (pcVar2 != (char *)0x0) {
      std::__cxx11::string::assign((char *)&local_1038);
      pcVar2 = realpath((rhs->state).full_name._M_dataplus._M_p,local_1018);
      if (pcVar2 == (char *)0x0) {
        _Var1 = false;
      }
      else {
        std::__cxx11::string::assign((char *)&local_1058);
        _Var1 = std::operator==(&local_1038,&local_1058);
      }
    }
    std::__cxx11::string::~string((string *)&local_1058);
    std::__cxx11::string::~string((string *)&local_1038);
  }
  return _Var1;
}

Assistant:

bool file::
    operator == (
        const file& rhs
    ) const 
    { 
        using namespace std;
        if (state.full_name.size() == 0 && rhs.state.full_name.size() == 0)
            return true;

        // These files might have different names but actually represent the same
        // file due to the presence of symbolic links.
        char buf[PATH_MAX];
        string left, right;
        if (realpath(state.full_name.c_str(),buf) == 0)
            return false;    
        left = buf;

        if (realpath(rhs.state.full_name.c_str(),buf) == 0)
            return false;    
        right = buf;

        return (left == right);
    }